

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,int _h,int _c,Allocator *_allocator)

{
  int in_ECX;
  int in_EDX;
  Allocator *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  undefined8 in_R9;
  int iVar1;
  Mat tmp;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  undefined8 in_stack_fffffffffffffde0;
  size_t in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  Mat *in_stack_fffffffffffffe00;
  undefined8 *puVar2;
  int in_stack_fffffffffffffe54;
  Mat *in_stack_fffffffffffffe58;
  Allocator *in_stack_fffffffffffffe60;
  long *local_188;
  int local_150;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  int in_stack_fffffffffffffed0;
  
  iVar1 = (int)((ulong)in_R9 >> 0x20);
  if (*(int *)((long)&in_RSI[5]._vptr_Allocator + 4) * *(int *)&in_RSI[6]._vptr_Allocator *
      *(int *)((long)&in_RSI[6]._vptr_Allocator + 4) * *(int *)&in_RSI[7]._vptr_Allocator ==
      in_EDX * in_ECX * in_R8D) {
    if (*(int *)&in_RSI[5]._vptr_Allocator < 3) {
      if ((long)in_EDX * (long)in_ECX !=
          ((long)in_EDX * (long)in_ECX * (long)in_RSI[2]._vptr_Allocator + 0xfU & 0xfffffffffffffff0
          ) / (ulong)in_RSI[2]._vptr_Allocator) {
        in_RDI->data = (void *)0x0;
        in_RDI->refcount = (int *)0x0;
        in_RDI->elemsize = 0;
        in_RDI->elempack = 0;
        in_RDI->allocator = (Allocator *)0x0;
        in_RDI->dims = 0;
        in_RDI->w = 0;
        in_RDI->h = 0;
        in_RDI->d = 0;
        in_RDI->c = 0;
        in_RDI->cstep = 0;
        create(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8,
               (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),in_stack_fffffffffffffde8,
               (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),in_stack_fffffffffffffe60);
        for (local_150 = 0; local_150 < in_R8D; local_150 = local_150 + 1) {
          memcpy((void *)((long)in_RDI->data + (long)local_150 * in_RDI->cstep * in_RDI->elemsize),
                 (_func_int **)
                 ((long)in_RSI->_vptr_Allocator +
                 (long)local_150 * (long)in_EDX * (long)in_ECX * (long)in_RSI[2]._vptr_Allocator),
                 (long)in_EDX * (long)in_ECX * (long)in_RSI[2]._vptr_Allocator);
        }
        return in_RDI;
      }
    }
    else if (*(int *)&in_RSI[7]._vptr_Allocator != in_R8D) {
      reshape(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_RSI);
      reshape((Mat *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_fffffffffffffed0,iVar1,
              (Allocator *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      puVar2 = (undefined8 *)&stack0xfffffffffffffe58;
      if (in_stack_fffffffffffffe60 != (Allocator *)0x0) {
        LOCK();
        iVar1 = *(int *)&in_stack_fffffffffffffe60->_vptr_Allocator;
        *(int *)&in_stack_fffffffffffffe60->_vptr_Allocator =
             *(int *)&in_stack_fffffffffffffe60->_vptr_Allocator + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_188 == (long *)0x0) {
            if (in_stack_fffffffffffffe58 != (Mat *)0x0) {
              free(in_stack_fffffffffffffe58);
            }
          }
          else {
            (**(code **)(*local_188 + 0x18))(local_188,in_stack_fffffffffffffe58);
          }
        }
      }
      *puVar2 = 0;
      puVar2[2] = 0;
      *(undefined4 *)(puVar2 + 3) = 0;
      *(undefined4 *)(puVar2 + 5) = 0;
      *(undefined4 *)((long)puVar2 + 0x2c) = 0;
      *(undefined4 *)(puVar2 + 6) = 0;
      *(undefined4 *)((long)puVar2 + 0x34) = 0;
      *(undefined4 *)(puVar2 + 7) = 0;
      puVar2[8] = 0;
      puVar2[1] = 0;
      return in_RDI;
    }
    in_RDI->data = in_RSI->_vptr_Allocator;
    in_RDI->refcount = (int *)in_RSI[1]._vptr_Allocator;
    in_RDI->elemsize = (size_t)in_RSI[2]._vptr_Allocator;
    in_RDI->elempack = *(int *)&in_RSI[3]._vptr_Allocator;
    in_RDI->allocator = (Allocator *)in_RSI[4]._vptr_Allocator;
    in_RDI->dims = *(int *)&in_RSI[5]._vptr_Allocator;
    in_RDI->w = *(int *)((long)&in_RSI[5]._vptr_Allocator + 4);
    in_RDI->h = *(int *)&in_RSI[6]._vptr_Allocator;
    in_RDI->d = *(int *)((long)&in_RSI[6]._vptr_Allocator + 4);
    in_RDI->c = *(int *)&in_RSI[7]._vptr_Allocator;
    in_RDI->cstep = (size_t)in_RSI[8]._vptr_Allocator;
    if (in_RDI->refcount != (int *)0x0) {
      LOCK();
      *in_RDI->refcount = *in_RDI->refcount + 1;
      UNLOCK();
    }
    in_RDI->dims = 3;
    in_RDI->w = in_EDX;
    in_RDI->h = in_ECX;
    in_RDI->d = 1;
    in_RDI->c = in_R8D;
    in_RDI->cstep =
         ((long)in_EDX * (long)in_ECX * (long)in_RSI[2]._vptr_Allocator + 0xfU & 0xfffffffffffffff0)
         / (ulong)in_RSI[2]._vptr_Allocator;
  }
  else {
    in_RDI->data = (void *)0x0;
    in_RDI->refcount = (int *)0x0;
    in_RDI->elemsize = 0;
    in_RDI->elempack = 0;
    in_RDI->allocator = (Allocator *)0x0;
    in_RDI->dims = 0;
    in_RDI->w = 0;
    in_RDI->h = 0;
    in_RDI->d = 0;
    in_RDI->c = 0;
    in_RDI->cstep = 0;
  }
  return in_RDI;
}

Assistant:

Mat Mat::reshape(int _w, int _h, int _c, Allocator* _allocator) const
{
    if (w * h * d * c != _w * _h * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h != alignSize((size_t)_w * _h * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _c, elemsize, elempack, _allocator);

            // align channel
            for (int i = 0; i < _c; i++)
            {
                const void* ptr = (unsigned char*)data + (size_t)i * _w * _h * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, (size_t)_w * _h * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _c, _allocator);
        return tmp.reshape(_w, _h, _c, _allocator);
    }

    Mat m = *this;

    m.dims = 3;
    m.w = _w;
    m.h = _h;
    m.d = 1;
    m.c = _c;

    m.cstep = alignSize((size_t)_w * _h * elemsize, 16) / elemsize;

    return m;
}